

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O0

c_v128 c_v128_shr_u32(c_v128 a,uint c)

{
  c_v64 hi;
  c_v64 lo;
  c_v64 in_RDI;
  c_v128 cVar1;
  c_v64 in_stack_ffffffffffffffb8;
  
  hi = c_v64_shr_u32(in_stack_ffffffffffffffb8,0);
  lo = c_v64_shr_u32(in_RDI,0);
  cVar1 = c_v128_from_v64(hi,lo);
  return cVar1;
}

Assistant:

SIMD_INLINE c_v128 c_v128_shr_u32(c_v128 a, const unsigned int c) {
  return c_v128_from_v64(c_v64_shr_u32(a.v64[1], c),
                         c_v64_shr_u32(a.v64[0], c));
}